

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O0

int s3gau_read(char *fn,vector_t ****out,uint32 *out_n_mgau,uint32 *out_n_feat,uint32 *out_n_density
              ,uint32 **out_veclen)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  uint32 local_ac;
  void *pvStack_a8;
  uint32 swap;
  vector_t ***o;
  float32 *raw;
  uint32 local_90;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 chksum;
  uint32 n;
  uint32 r;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 blk;
  uint32 *veclen;
  uint local_60;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  char *ver;
  char *do_chk;
  FILE *fp;
  uint32 **out_veclen_local;
  uint32 *out_n_density_local;
  uint32 *out_n_feat_local;
  uint32 *out_n_mgau_local;
  vector_t ****out_local;
  char *fn_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  ignore = 0;
  raw._4_4_ = 0;
  fp = (FILE *)out_veclen;
  out_veclen_local = (uint32 **)out_n_density;
  out_n_density_local = out_n_feat;
  out_n_feat_local = out_n_mgau;
  out_n_mgau_local = (uint32 *)out;
  out_local = (vector_t ****)fn;
  do_chk = (char *)s3open(fn,"rb",&local_ac);
  if ((FILE *)do_chk == (FILE *)0x0) {
    return -1;
  }
  _n_feat = s3get_gvn_fattr("version");
  if (_n_feat == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
            ,0x5b,"No version attribute for %s\n",out_local);
    exit(1);
  }
  iVar1 = strcmp(_n_feat,"1.0");
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
            ,0x57,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_local,_n_feat,
            "1.0");
    exit(1);
  }
  ver = s3get_gvn_fattr("chksum0");
  if ((ver != (char *)0x0) && (iVar1 = strcmp(ver,"no"), iVar1 == 0)) {
    ver = (char *)0x0;
  }
  iVar2 = bio_fread(&n_density,4,1,(FILE *)do_chk,local_ac,&ignore);
  if (((iVar2 == 1) &&
      (iVar2 = bio_fread(&local_60,4,1,(FILE *)do_chk,local_ac,&ignore), iVar2 == 1)) &&
     (iVar2 = bio_fread((void *)((long)&veclen + 4),4,1,(FILE *)do_chk,local_ac,&ignore), iVar2 == 1
     )) {
    _i = __ckd_calloc__((ulong)local_60,4,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                        ,0x71);
    uVar3 = bio_fread(_i,4,local_60,(FILE *)do_chk,local_ac,&ignore);
    if (uVar3 == local_60) {
      iVar2 = bio_fread_1d(&o,4,&sv_chksum,(FILE *)do_chk,local_ac,&ignore);
      if (iVar2 < 0) {
        ckd_free(_i);
      }
      else {
        j = 0;
        for (k = 0; k < local_60; k = k + 1) {
          j = *(int *)((long)_i + (ulong)k * 4) + j;
        }
        if (sv_chksum == n_density * veclen._4_4_ * j) {
          pvStack_a8 = __ckd_calloc_3d__((ulong)n_density,(ulong)local_60,(ulong)veclen._4_4_,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                                         ,0x86);
          chksum = 0;
          for (k = 0; k < n_density; k = k + 1) {
            for (r = 0; r < local_60; r = r + 1) {
              for (n = 0; n < veclen._4_4_; n = n + 1) {
                *(ulong *)(*(long *)(*(long *)((long)pvStack_a8 + (ulong)k * 8) + (ulong)r * 8) +
                          (ulong)n * 8) = (long)o + (ulong)chksum * 4;
                chksum = *(int *)((long)_i + (ulong)r * 4) + chksum;
              }
            }
          }
          if (ver != (char *)0x0) {
            iVar2 = bio_fread(&local_90,4,1,(FILE *)do_chk,local_ac,(uint32 *)((long)&raw + 4));
            if (iVar2 != 1) goto LAB_00107860;
            if (local_90 != ignore) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                      ,0x9b,"Checksum error; read corrupt data.\n");
              exit(1);
            }
          }
          *(void **)out_n_mgau_local = pvStack_a8;
          *out_n_feat_local = n_density;
          *out_n_density_local = local_60;
          *(uint *)out_veclen_local = veclen._4_4_;
          *(void **)fp = _i;
          s3close((FILE *)do_chk);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                  ,0xa9,"Read %s [%ux%ux%u array]\n",out_local,(ulong)n_density,
                  CONCAT44(uVar4,local_60),veclen._4_4_);
          return 0;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                ,0x81,"Failed to read parameter file %s (expected %d values, got %d)\n",out_local,
                (ulong)(n_density * veclen._4_4_ * j),CONCAT44(uVar4,sv_chksum));
      }
    }
  }
LAB_00107860:
  if (do_chk != (char *)0x0) {
    s3close((FILE *)do_chk);
  }
  return -1;
}

Assistant:

int
s3gau_read(const char *fn,
	   vector_t ****out,
	   uint32 *out_n_mgau,
	   uint32 *out_n_feat,
	   uint32 *out_n_density,
	   uint32 **out_veclen)
{
    FILE *fp;
    const char *do_chk;
    const char *ver;
    uint32 n_mgau, n_feat, n_density;
    uint32 *veclen;
    uint32 blk, i, j, k, r, n;
    uint32 chksum = 0;
    uint32 sv_chksum, ignore = 0;
    float32 *raw;
    vector_t ***o;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAU_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAU_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (do_chk && !strcmp(do_chk, "no")) {
        do_chk = NULL;
    }
    
    if (bio_fread(&n_mgau, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_feat, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_density, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    veclen = ckd_calloc(n_feat, sizeof(uint32));
    if (bio_fread(veclen, sizeof(uint32), n_feat, fp, swap, &chksum) != n_feat) {
	goto error;
    }

    if (bio_fread_1d((void **)&raw, sizeof(float32), &n, fp, swap, &chksum) < 0) {
	ckd_free(veclen);

	goto error;
    }

    for (i = 0, blk = 0; i < n_feat; i++) {
	blk += veclen[i];
    }
    if (n != n_mgau * n_density * blk) {
	E_ERROR("Failed to read parameter file %s (expected %d values, got %d)\n",
		fn, n_mgau * n_density * blk, n);
	goto error;
    }

    o = (vector_t ***)ckd_calloc_3d(n_mgau, n_feat, n_density,
				    sizeof(vector_t));

    for (i = 0, r = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		o[i][j][k] = &raw[r];

		r += veclen[j];
	    }
	}
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
            goto error;
	}

	if (sv_chksum != chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }


    *out = o;
    *out_n_mgau = n_mgau;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);

    return S3_ERROR;
}